

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Array<double,_9> * __thiscall
tcu::Matrix<double,_3,_3>::getColumnMajorData
          (Array<double,_9> *__return_storage_ptr__,Matrix<double,_3,_3> *this)

{
  Array<double,_9> *pAVar1;
  int col;
  long lVar2;
  Array<double,_9> *a;
  long lVar3;
  
  pAVar1 = __return_storage_ptr__;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 8) {
      *(undefined8 *)((long)__return_storage_ptr__ + lVar3) =
           *(undefined8 *)
            ((long)((Vector<tcu::Vector<double,_3>,_3> *)((Vector<double,_3> *)this)->m_data)->
                   m_data[0].m_data + lVar3);
    }
    this = (Matrix<double,_3,_3> *)((long)this + 0x18);
    __return_storage_ptr__ = (Array<double,_9> *)((long)__return_storage_ptr__ + 0x18);
  }
  return pAVar1;
}

Assistant:

Array<T, Rows*Cols> Matrix<T, Rows, Cols>::getColumnMajorData (void) const
{
	Array<T, Rows*Cols> a;
	T* dst = a.getPtr();
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			*dst++ = (*this)(row, col);
	return a;
}